

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IElseReader.cpp
# Opt level: O2

void __thiscall IElseReader::getWord(IElseReader *this,string *str)

{
  char cVar1;
  int iVar2;
  char cVar3;
  bool bVar4;
  
  iVar2 = 4;
  while( true ) {
    bVar4 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    cVar3 = (char)str;
    if (bVar4) break;
    std::istream::get();
    std::__cxx11::string::push_back(cVar3);
  }
  bVar4 = std::operator!=(str,"else");
  if (bVar4) {
    std::__cxx11::string::assign((char *)str);
    return;
  }
  while( true ) {
    cVar1 = std::istream::get();
    bVar4 = IDictionary::isBlankSep(cVar1);
    if (!bVar4) break;
    std::__cxx11::string::push_back(cVar3);
    if (cVar1 == '\n') {
      std::__cxx11::string::push_back(cVar3);
    }
  }
  if (cVar1 == ';') {
    std::__cxx11::string::push_back(cVar3);
    return;
  }
  if (cVar1 == '{') {
    std::__cxx11::string::push_back(cVar3);
    bVar4 = true;
    while ((iVar2 = std::istream::get(), bVar4 && (iVar2 = iVar2 << 0x18, iVar2 != -0x1000000))) {
      std::__cxx11::string::push_back(cVar3);
      if (iVar2 == 0x7d000000) {
        bVar4 = false;
      }
      else {
        bVar4 = true;
        if (iVar2 == 0xa000000) {
          std::__cxx11::string::push_back(cVar3);
          bVar4 = true;
        }
      }
    }
  }
  else {
    do {
      std::__cxx11::string::push_back(cVar3);
      cVar1 = std::istream::get();
    } while (cVar1 != ';');
  }
  return;
}

Assistant:

void IElseReader::getWord(std::string &str) {
    char tempChar;
    int num_3l;

    for(int i=0;i<4;i++)
    {
        tempChar=m_ifs->get();
        str+=tempChar;
    }
    if(str!="else") {
        str = "";
        return;
    }
    while(true)
    {
        tempChar=m_ifs->get();
        if(IDictionary::isBlankSep(tempChar))
        {
            str+=tempChar;
            if(tempChar=='\n')
                str+='\n';
        }
        else
            break;
    }

    if(tempChar=='{')
    {
        str+=tempChar;
        num_3l=1;

        while ((tempChar=m_ifs->get())!=EOF&&num_3l)
        {
            str+=tempChar;
            if(tempChar=='\n')
            {
                str+='\n';
            }
            else if(tempChar=='}')
                num_3l--;
        }
    }
    else if(tempChar==';')
    {
        str+=tempChar;
        return;
    }
    else
    {
        do{
            str+=tempChar;
            tempChar=m_ifs->get();
        }while (tempChar!=';');
    }
}